

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O2

symbol_id_pair_t * symbol_find(list_t *list,char *name)

{
  symbol_id_pair_t *psVar1;
  int iVar2;
  
  do {
    list = (list_t *)((list_node_t *)list)->next;
    if ((list_node_t *)list == (list_node_t *)0x0) {
      return (symbol_id_pair_t *)0x0;
    }
    psVar1 = (symbol_id_pair_t *)((list_node_t *)list)->data;
    iVar2 = strcmp(psVar1->name,name);
  } while (iVar2 != 0);
  return psVar1;
}

Assistant:

static symbol_id_pair_t*
symbol_find(
    list_t* list,
    char* name
) {
    symbol_id_pair_t* symbol;
    list_for_each(list, symbol) {
        if (strcmp(symbol->name, name) == 0)
            return symbol;
    }
    return NULL;
}